

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_Mesh::SetTextureCoordinatesEx
          (ON_Mesh *this,ON_TextureMapping *mapping,ON_Xform *mesh_xform,bool bLazy,bool bSeamCheck)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ON_2fPoint *mesh_T_00;
  int *local_338;
  bool local_2f2;
  ON_3dPoint local_2e8;
  int local_2d0;
  int local_2cc;
  int vcnt;
  int vi;
  ON_3dPoint T;
  ON_2fPoint *meshT;
  int mesh_T_stride;
  float *mesh_T;
  double dStack_290;
  bool rc;
  double two_pi_tc;
  undefined1 local_278 [8];
  ON_TextureMapping mp;
  ON_SimpleArray<int> *Tsd;
  ON_SimpleArray<int> Tside;
  bool bSeamCheck_local;
  bool bLazy_local;
  ON_Xform *mesh_xform_local;
  ON_TextureMapping *mapping_local;
  ON_Mesh *this_local;
  
  Tside.m_capacity._2_1_ = bSeamCheck;
  Tside.m_capacity._3_1_ = bLazy;
  bVar1 = ON_TextureMapping::RequiresVertexNormals(mapping);
  if ((bVar1) && (bVar1 = HasVertexNormals(this), !bVar1)) {
    ComputeVertexNormals(this);
  }
  InvalidateTextureCoordinateBoundingBox(this);
  ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&Tsd);
  mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ON_TextureMapping::ON_TextureMapping((ON_TextureMapping *)local_278,mapping);
  dStack_290 = 1.0;
  if ((Tside.m_capacity._2_1_ & 1) != 0) {
    bVar1 = SeamCheckHelper((ON_TextureMapping *)local_278,&stack0xfffffffffffffd70,
                            (ON_SimpleArray<int> *)&Tsd,
                            (ON_SimpleArray<int> **)
                            &mp.m_mapping_primitive.
                             super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    local_2f2 = false;
    if (bVar1) {
      local_2f2 = HasSharedVertices(this);
    }
    Tside.m_capacity._2_1_ = local_2f2;
    if (local_2f2 != false) {
      memcpy(mp.m_Nxyz.m_xform[3] + 3,&ON_Xform::IdentityTransformation,0x80);
    }
  }
  bVar1 = ON_TextureMapping::GetTextureCoordinates
                    ((ON_TextureMapping *)local_278,this,
                     &(this->m_T).super_ON_SimpleArray<ON_2fPoint>,mesh_xform,
                     (bool)(Tside.m_capacity._3_1_ & 1),
                     (ON_SimpleArray<int> *)
                     mp.m_mapping_primitive.
                     super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
  if ((mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (iVar3 = ON_SimpleArray<int>::Count
                        ((ON_SimpleArray<int> *)
                         mp.m_mapping_primitive.
                         super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi), iVar3 == 0)) {
    Tside.m_capacity._2_1_ = 0;
  }
  if ((((bVar1) && (ON_MappingTag::Set(&this->m_Ttag,mapping), mesh_xform != (ON_Xform *)0x0)) &&
      (bVar2 = ON_Xform::IsValid(mesh_xform), bVar2)) &&
     ((bVar2 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar2 &&
      (bVar2 = ON_Xform::IsZero(mesh_xform), !bVar2)))) {
    memcpy(&(this->m_Ttag).m_mesh_xform,mesh_xform,0x80);
  }
  if (((bVar1) && ((Tside.m_capacity._2_1_ & 1) != 0)) &&
     ((bVar2 = HasTextureCoordinates(this), bVar2 &&
      (iVar3 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F), 0 < iVar3)))) {
    mesh_T_00 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
    if (mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar3 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&Tsd);
      iVar4 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      if (iVar3 != iVar4) {
        mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
    }
    if (mp.m_mapping_primitive.super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_338 = (int *)0x0;
    }
    else {
      local_338 = ON_SimpleArray<int>::Array((ON_SimpleArray<int> *)&Tsd);
    }
    AdjustMeshPeriodicTextureCoordinatesHelper
              (this,mesh_xform,&mesh_T_00->x,2,local_338,dStack_290,(ON_TextureMapping *)local_278);
    bVar2 = ON_Xform::IsIdentity(&mapping->m_uvw,0.0);
    if ((!bVar2) && (bVar2 = ON_Xform::IsZero(&mapping->m_uvw), !bVar2)) {
      T.z = (double)ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>)
      ;
      local_2d0 = ON_SimpleArray<ON_2fPoint>::Count(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
      for (local_2cc = 0; local_2cc < local_2d0; local_2cc = local_2cc + 1) {
        _vcnt = (double)*(float *)((long)T.z + (long)local_2cc * 8);
        T.x = (double)*(float *)((long)T.z + 4 + (long)local_2cc * 8);
        T.y = 0.0;
        ON_Xform::operator*(&local_2e8,&mapping->m_uvw,(ON_3dPoint *)&vcnt);
        *(float *)((long)T.z + (long)local_2cc * 8) = (float)local_2e8.x;
        *(float *)((long)T.z + 4 + (long)local_2cc * 8) = (float)local_2e8.y;
      }
    }
  }
  ON_TextureMapping::~ON_TextureMapping((ON_TextureMapping *)local_278);
  ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&Tsd);
  return bVar1;
}

Assistant:

bool ON_Mesh::SetTextureCoordinatesEx(
                  const class ON_TextureMapping& mapping,
                  const class ON_Xform* mesh_xform,
                  bool bLazy,
                  bool bSeamCheck
                  )
{
  if ( mapping.RequiresVertexNormals() && !HasVertexNormals() )
    ComputeVertexNormals();

  InvalidateTextureCoordinateBoundingBox();

  ON_SimpleArray<int> Tside;
  ON_SimpleArray<int>* Tsd = 0;
  ON_TextureMapping mp = mapping;

  double two_pi_tc = 1.0;

  if (bSeamCheck)
  {
    bSeamCheck = SeamCheckHelper(mp, two_pi_tc, Tside, Tsd) && HasSharedVertices(*this);
    if (bSeamCheck)
      mp.m_uvw = ON_Xform::IdentityTransformation;
  }

  // Use mp instead of mapping to call GetTextureCoordinates()
  // because m_uvw must be the identity if we have seams.
  bool rc = mp.GetTextureCoordinates(*this,m_T,mesh_xform,bLazy,Tsd);

  if (Tsd != nullptr && Tsd->Count() == 0)
  {
    // Tsd array is needed for seam check but it was not filled by GetTextureCoordinates.
    // This happened because matching texture coordinates were found. These coordinates
    // were already once seam checked. So seam check can be skipped now.
    bSeamCheck = false;
  }

  if (rc)
  {
    // update the texture coordinate tag
    m_Ttag.Set(mapping);
    if (    mesh_xform
         && mesh_xform->IsValid()
         && !mesh_xform->IsIdentity()
         && !mesh_xform->IsZero()
       )
    {
      m_Ttag.m_mesh_xform  = *mesh_xform;
    }
  }

  if ( rc && bSeamCheck && HasTextureCoordinates() && m_F.Count() > 0 )
  {
    float* mesh_T = (float*)m_T.Array();
    int mesh_T_stride = sizeof(m_T[0])/sizeof(mesh_T[0]);
    if ( Tsd && Tside.Count() != m_V.Count() )
      Tsd = 0;
    AdjustMeshPeriodicTextureCoordinatesHelper( *this, mesh_xform, mesh_T, mesh_T_stride, Tsd ? Tside.Array() : 0, two_pi_tc, mp );
    mesh_T = 0; // when the array is grown, the pointer may become invalid
    if ( !mapping.m_uvw.IsIdentity() && !mapping.m_uvw.IsZero() )
    {
      // Apply the uvw transformation that is on mapping
      // to the texture coordinates.
      ON_2fPoint* meshT = m_T.Array();
      ON_3dPoint T;
      int vi, vcnt = m_T.Count();
      for ( vi = 0; vi < vcnt; vi++ )
      {
        T.x = meshT[vi].x;
        T.y = meshT[vi].y;
        T.z = 0.0;
        T = mapping.m_uvw*T;
        meshT[vi].x = (float)T.x;
        meshT[vi].y = (float)T.y;
      }
    }
  }

  return rc;
}